

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLCache.c
# Opt level: O2

void cuddHashTableQuit(DdHashTable *hash)

{
  uint uVar1;
  DdManager *table;
  DdHashItem *pDVar2;
  DdHashItem *pDVar3;
  ulong uVar4;
  
  table = hash->manager;
  uVar1 = hash->numBuckets;
  for (uVar4 = 0; uVar4 != uVar1; uVar4 = uVar4 + 1) {
    pDVar3 = (DdHashItem *)(hash->bucket + uVar4);
    while (pDVar3 = pDVar3->next, pDVar3 != (DdHashItem *)0x0) {
      Cudd_RecursiveDeref(table,pDVar3->value);
    }
  }
  pDVar3 = (DdHashItem *)hash->memoryList;
  while (pDVar3 != (DdHashItem *)0x0) {
    pDVar2 = pDVar3->next;
    free(pDVar3);
    pDVar3 = pDVar2;
  }
  free(hash->bucket);
  free(hash);
  return;
}

Assistant:

void
cuddHashTableQuit(
  DdHashTable * hash)
{
#ifdef __osf__
#pragma pointer_size save
#pragma pointer_size short
#endif
    unsigned int i;
    DdManager *dd = hash->manager;
    DdHashItem *bucket;
    DdHashItem **memlist, **nextmem;
    unsigned int numBuckets = hash->numBuckets;

    for (i = 0; i < numBuckets; i++) {
        bucket = hash->bucket[i];
        while (bucket != NULL) {
            Cudd_RecursiveDeref(dd, bucket->value);
            bucket = bucket->next;
        }
    }

    memlist = hash->memoryList;
    while (memlist != NULL) {
        nextmem = (DdHashItem **) memlist[0];
        ABC_FREE(memlist);
        memlist = nextmem;
    }

    ABC_FREE(hash->bucket);
    ABC_FREE(hash);
#ifdef __osf__
#pragma pointer_size restore
#endif

    return;

}